

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O1

void pybind11::detail::clear_instance(PyObject *self)

{
  ulong uVar1;
  PyTypeObject *t;
  long lVar2;
  void *valueptr;
  byte bVar3;
  _Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>
  _Var4;
  type_info *tinfo;
  internals *piVar5;
  _Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false> __it;
  undefined8 *puVar6;
  long *plVar7;
  bool bVar8;
  pair<std::__detail::_Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>,_bool>
  pVar9;
  pair<std::__detail::_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>_>
  pVar10;
  iterator __begin2;
  instance *local_58;
  ulong local_50;
  PyTypeObject *in_stack_ffffffffffffffb8;
  type_info *ptVar11;
  PyObject *local_40;
  void *local_38;
  
  t = self->ob_type;
  pVar9 = all_type_info_get_cache(in_stack_ffffffffffffffb8);
  _Var4 = pVar9.first.
          super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
          ._M_cur;
  if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    all_type_info_populate
              (t,(vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                  *)((long)_Var4.
                           super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                           ._M_cur + 0x10));
  }
  plVar7 = (long *)((long)_Var4.
                          super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                          ._M_cur + 0x10);
  puVar6 = *(undefined8 **)
            ((long)_Var4.
                   super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                   ._M_cur + 0x18);
  if (*(undefined8 **)
       ((long)_Var4.
              super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
              ._M_cur + 0x10) == puVar6) {
    tinfo = (type_info *)0x0;
  }
  else {
    tinfo = (type_info *)
            **(undefined8 **)
              ((long)_Var4.
                     super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                     ._M_cur + 0x10);
  }
  local_50 = 0;
  local_40 = self + 1;
  if ((self[3].ob_refcnt & 2) == 0) {
    local_40 = (PyObject *)local_40->ob_refcnt;
  }
  lVar2 = *plVar7;
  local_58 = (instance *)self;
  do {
    if (local_50 == (long)puVar6 - lVar2 >> 3) {
      instance::deallocate_layout((instance *)self);
      if (self[2].ob_type != (PyTypeObject *)0x0) {
        PyObject_ClearWeakRefs(self);
      }
      puVar6 = (undefined8 *)_PyObject_GetDictPtr(self);
      if ((puVar6 != (undefined8 *)0x0) && (plVar7 = (long *)*puVar6, plVar7 != (long *)0x0)) {
        *puVar6 = 0;
        *plVar7 = *plVar7 + -1;
        if (*plVar7 == 0) {
          _Py_Dealloc();
        }
      }
      if ((self[3].ob_refcnt & 0x10) != 0) {
        clear_patients(self);
      }
      return;
    }
    valueptr = (void *)local_40->ob_refcnt;
    if (valueptr != (void *)0x0) {
      if ((local_58->field_0x30 & 2) == 0) {
        bVar3 = *(byte *)((long)(local_58->field_1).simple_value_holder[1] + local_50) & 2;
      }
      else {
        bVar3 = (byte)local_58->field_0x30 >> 3 & 1;
      }
      ptVar11 = tinfo;
      if (bVar3 != 0) {
        local_38 = valueptr;
        piVar5 = get_internals();
        pVar10 = std::
                 _Hashtable<const_void_*,_std::pair<const_void_*const,_pybind11::detail::instance_*>,_std::allocator<std::pair<const_void_*const,_pybind11::detail::instance_*>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                 ::equal_range(&(piVar5->registered_instances)._M_h,&local_38);
        __it._M_cur = (__node_type *)
                      pVar10.first.
                      super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                      ._M_cur;
        bVar8 = (_Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                 )__it._M_cur !=
                pVar10.second.
                super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                ._M_cur.
                super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
        ;
        if (bVar8) {
          do {
            if (self->ob_type == *(PyTypeObject **)(*(long *)((long)__it._M_cur + 0x10) + 8)) {
              std::
              _Hashtable<const_void_*,_std::pair<const_void_*const,_pybind11::detail::instance_*>,_std::allocator<std::pair<const_void_*const,_pybind11::detail::instance_*>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
              ::erase(&(piVar5->registered_instances)._M_h,(const_iterator)__it._M_cur);
              bVar8 = true;
              break;
            }
            __it._M_cur = *__it._M_cur;
            bVar8 = (_Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                     )__it._M_cur !=
                    pVar10.second.
                    super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                    ._M_cur.
                    super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
            ;
          } while (bVar8);
        }
        if ((tinfo->field_0x90 & 2) == 0) {
          traverse_offset_bases(valueptr,tinfo,(instance *)self,deregister_instance_impl);
        }
        if (!bVar8) {
          pybind11_fail("pybind11_object_dealloc(): Tried to deallocate unregistered instance!");
        }
      }
      if ((self[3].ob_refcnt & 1) == 0) {
        if ((local_58->field_0x30 & 2) == 0) {
          bVar3 = *(byte *)((long)(local_58->field_1).simple_value_holder[1] + local_50);
        }
        else {
          bVar3 = (byte)local_58->field_0x30 >> 2;
        }
        if ((bVar3 & 1) == 0) goto LAB_00111a3c;
      }
      (*ptVar11->dealloc)((value_and_holder *)&local_58);
    }
LAB_00111a3c:
    if ((self[3].ob_refcnt & 2) == 0) {
      local_40 = (PyObject *)
                 (&local_40->ob_type + *(long *)(*(long *)(*plVar7 + local_50 * 8) + 0x20));
    }
    uVar1 = local_50 + 1;
    if (uVar1 < (ulong)(*(long *)((long)_Var4.
                                        super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                                        ._M_cur + 0x18) - *plVar7 >> 3)) {
      tinfo = *(type_info **)(*plVar7 + 8 + local_50 * 8);
      local_50 = uVar1;
    }
    else {
      tinfo = (type_info *)0x0;
      local_50 = uVar1;
    }
  } while( true );
}

Assistant:

inline void clear_instance(PyObject *self) {
    auto instance = reinterpret_cast<detail::instance *>(self);

    // Deallocate any values/holders, if present:
    for (auto &v_h : values_and_holders(instance)) {
        if (v_h) {

            // We have to deregister before we call dealloc because, for virtual MI types, we still
            // need to be able to get the parent pointers.
            if (v_h.instance_registered() && !deregister_instance(instance, v_h.value_ptr(), v_h.type))
                pybind11_fail("pybind11_object_dealloc(): Tried to deallocate unregistered instance!");

            if (instance->owned || v_h.holder_constructed())
                v_h.type->dealloc(v_h);
        }
    }
    // Deallocate the value/holder layout internals:
    instance->deallocate_layout();

    if (instance->weakrefs)
        PyObject_ClearWeakRefs(self);

    PyObject **dict_ptr = _PyObject_GetDictPtr(self);
    if (dict_ptr)
        Py_CLEAR(*dict_ptr);

    if (instance->has_patients)
        clear_patients(self);
}